

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

void ReadFillInMissingBoxes(ON_Brep *brep)

{
  uint uVar1;
  uint uVar2;
  ON_BrepLoop *pOVar3;
  bool bVar4;
  ulong uVar5;
  ON_Curve *this;
  ulong uVar6;
  ON_BrepTrim *this_00;
  long lVar7;
  ON_BoundingBox local_60;
  
  uVar1 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  lVar7 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar2 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  for (; uVar5 * 0xe8 - lVar7 != 0; lVar7 = lVar7 + 0xe8) {
    this_00 = (ON_BrepTrim *)
              ((long)&(((ON_CurveProxy *)
                       (&(((brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                         m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                      super_ON_Object._vptr_ON_Object + lVar7);
    bVar4 = ON_BoundingBox::IsValid(&this_00->m_pbox);
    if ((!bVar4) && (this = ON_BrepTrim::TrimCurveOf(this_00), this != (ON_Curve *)0x0)) {
      ON_Geometry::BoundingBox(&local_60,&this->super_ON_Geometry);
      (this_00->m_pbox).m_max.y = local_60.m_max.y;
      (this_00->m_pbox).m_max.z = local_60.m_max.z;
      (this_00->m_pbox).m_min.z = local_60.m_min.z;
      (this_00->m_pbox).m_max.x = local_60.m_max.x;
      (this_00->m_pbox).m_min.x = local_60.m_min.x;
      (this_00->m_pbox).m_min.y = local_60.m_min.y;
    }
  }
  uVar6 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pOVar3 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    bVar4 = ON_BoundingBox::IsValid(&pOVar3[uVar6].m_pbox);
    if (!bVar4) {
      for (lVar7 = 0; lVar7 < pOVar3[uVar6].m_ti.m_count; lVar7 = lVar7 + 1) {
        uVar2 = pOVar3[uVar6].m_ti.m_a[lVar7];
        if ((int)uVar2 < (int)uVar1 && -1 < (int)uVar2) {
          ON_BoundingBox::Union
                    (&pOVar3[uVar6].m_pbox,
                     &(brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                      .m_a[uVar2].m_pbox);
        }
      }
    }
  }
  return;
}

Assistant:

static
void ReadFillInMissingBoxes( ON_Brep& brep )
{
  // older files did not save bounding box information
  int ti, li, lti, trim_count, loop_count;
  const ON_Curve* c2;
  trim_count = brep.m_T.Count();
  loop_count = brep.m_L.Count();
  for ( ti = 0; ti < trim_count; ti++ )
  {
    ON_BrepTrim& trim = brep.m_T[ti];
    if ( !trim.m_pbox.IsValid() ) 
    {
      c2 = trim.TrimCurveOf();
      if ( c2 )
        trim.m_pbox = c2->BoundingBox();
    }
  }

  for ( li = 0; li < loop_count; li++ )
  {
    ON_BrepLoop& loop = brep.m_L[li];
    if ( !loop.m_pbox.IsValid() ) 
    {
      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        ti = loop.m_ti[lti];
        if ( ti >= 0 && ti < trim_count )
          loop.m_pbox.Union( brep.m_T[ti].m_pbox );
      }
    }
  }
}